

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O3

void __thiscall cppcms::encoding::impl::validators_set::validators_set(validators_set *this)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  mapped_type *pp_Var3;
  key_type local_70;
  key_type local_50;
  
  p_Var1 = &(this->predefined_)._M_t._M_impl.super__Rb_tree_header;
  (this->predefined_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->predefined_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->predefined_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->predefined_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->predefined_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar2 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"latin1","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"iso88591","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"iso88592","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"iso88594","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"iso88595","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"iso88599","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"iso885910","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"iso885913","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"iso885914","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"iso885915","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"iso885916","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"iso88593","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = iso_8859_3_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"iso88596","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = iso_8859_6_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"iso88597","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = iso_8859_7_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"iso88598","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = iso_8859_8_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"iso885911","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = iso_8859_11_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"windows1250","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = windows_1250_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"windows1251","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = windows_1251_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"windows1252","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = windows_1252_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"windows1253","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = windows_1253_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"windows1255","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = windows_1255_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"windows1256","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = windows_1256_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"windows1257","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = windows_1257_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"windows1258","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = windows_1258_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"cp1250","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = windows_1250_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"cp1251","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = windows_1251_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"cp1252","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = windows_1252_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"cp1253","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = windows_1253_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"cp1255","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = windows_1255_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"cp1256","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = windows_1256_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"cp1257","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = windows_1257_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"cp1258","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = windows_1258_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"koi8r","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = koi8_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"koi8u","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = koi8_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"utf8","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = utf8_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ascii","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_70);
  *pp_Var3 = ascii_valid<char_const*>;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"usascii","");
  pp_Var3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&),_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::operator[](&this->predefined_,&local_50);
  *pp_Var3 = ascii_valid<char_const*>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

validators_set() 
		{

			encoding_tester_type iso_tester=&iso_8859_1_2_4_5_9_10_13_14_15_16_valid<char const *>;

			
			predefined_["latin1"]=iso_tester;
			
			predefined_["iso88591"]=iso_tester;
			predefined_["iso88592"]=iso_tester;
			predefined_["iso88594"]=iso_tester;
			predefined_["iso88595"]=iso_tester;
			predefined_["iso88599"]=iso_tester;
			predefined_["iso885910"]=iso_tester;
			predefined_["iso885913"]=iso_tester;
			predefined_["iso885914"]=iso_tester;
			predefined_["iso885915"]=iso_tester;
			predefined_["iso885916"]=iso_tester;

			predefined_["iso88593"]=&iso_8859_3_valid<char const *>;
			predefined_["iso88596"]=&iso_8859_6_valid<char const *>;
			predefined_["iso88597"]=&iso_8859_7_valid<char const *>;
			predefined_["iso88598"]=&iso_8859_8_valid<char const *>;
			predefined_["iso885911"]=&iso_8859_11_valid<char const *>;

			predefined_["windows1250"]=&windows_1250_valid<char const *>;
			predefined_["windows1251"]=&windows_1251_valid<char const *>;
			predefined_["windows1252"]=&windows_1252_valid<char const *>;
			predefined_["windows1253"]=&windows_1253_valid<char const *>;
			predefined_["windows1255"]=&windows_1255_valid<char const *>;
			predefined_["windows1256"]=&windows_1256_valid<char const *>;
			predefined_["windows1257"]=&windows_1257_valid<char const *>;
			predefined_["windows1258"]=&windows_1258_valid<char const *>;

			predefined_["cp1250"]=&windows_1250_valid<char const *>;
			predefined_["cp1251"]=&windows_1251_valid<char const *>;
			predefined_["cp1252"]=&windows_1252_valid<char const *>;
			predefined_["cp1253"]=&windows_1253_valid<char const *>;
			predefined_["cp1255"]=&windows_1255_valid<char const *>;
			predefined_["cp1256"]=&windows_1256_valid<char const *>;
			predefined_["cp1257"]=&windows_1257_valid<char const *>;
			predefined_["cp1258"]=&windows_1258_valid<char const *>;

			predefined_["koi8r"]=&koi8_valid<char const *>;
			predefined_["koi8u"]=&koi8_valid<char const *>;
			
			predefined_["utf8"]=&utf8_valid<char const *>;
			predefined_["usascii"]=predefined_["ascii"]=&ascii_valid<char const *>;
		}